

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::ExplicitUniformLocationCaseBase::runQueryUniformSubroutine
          (ExplicitUniformLocationCaseBase *this,CompiledProgram *program,GLenum stage,
          SubroutineUniform *subroutineUniform,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *usedLocations,
          GLint max)

{
  GLuint GVar1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *psVar2;
  GLenum GVar3;
  bool bVar4;
  key_type kVar5;
  string *psVar6;
  GLchar *pGVar7;
  Logger *pLVar8;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar9;
  byte local_b01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a90;
  Logger local_a70;
  _Base_ptr local_8f0;
  undefined1 local_8e8;
  key_type local_8dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  Logger local_8b8;
  _Self local_738;
  key_type local_72c;
  _Self local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  Logger local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  Logger local_560;
  key_type local_3e0;
  allocator<unsigned_int> local_3d9;
  GLint expected;
  key_type local_3c0;
  byte local_3b9;
  GLint reservedLocation;
  bool used;
  Logger local_398;
  string local_218 [32];
  key_type local_1f8;
  GLenum local_1f4;
  GLint returnedPIQ;
  GLenum piqStage;
  key_type local_1d0 [2];
  GLint returned;
  undefined1 local_1c0 [8];
  ostringstream name;
  long lStack_40;
  int arrayElem;
  long ret;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *psStack_30;
  GLint max_local;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *usedLocations_local;
  SubroutineUniform *subroutineUniform_local;
  CompiledProgram *pCStack_18;
  GLenum stage_local;
  CompiledProgram *program_local;
  ExplicitUniformLocationCaseBase *this_local;
  
  lStack_40 = 0;
  name._372_4_ = 0;
  ret._4_4_ = max;
  psStack_30 = usedLocations;
  usedLocations_local =
       (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
       subroutineUniform;
  subroutineUniform_local._4_4_ = stage;
  pCStack_18 = program;
  program_local = (CompiledProgram *)this;
  do {
    if (*(int *)((long)&usedLocations_local[1]._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_parent + 4) <= (int)name._372_4_) {
      return lStack_40;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    psVar6 = glcts::(anonymous_namespace)::SubroutineUniform::getName_abi_cxx11_
                       ((SubroutineUniform *)usedLocations_local);
    std::operator<<((ostream *)local_1c0,(string *)psVar6);
    SubroutineUniform::streamArrayStr
              ((SubroutineUniform *)usedLocations_local,(ostringstream *)local_1c0,name._372_4_);
    GVar3 = subroutineUniform_local._4_4_;
    GVar1 = pCStack_18->name;
    std::__cxx11::ostringstream::str();
    pGVar7 = (GLchar *)std::__cxx11::string::c_str();
    kVar5 = glu::CallLogWrapper::glGetSubroutineUniformLocation
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,GVar3,
                       pGVar7);
    std::__cxx11::string::~string((string *)&returnedPIQ);
    local_1f4 = 0;
    local_1d0[0] = kVar5;
    if (subroutineUniform_local._4_4_ == 0x8b30) {
      local_1f4 = 0x92f2;
    }
    else if (subroutineUniform_local._4_4_ == 0x8b31) {
      local_1f4 = 0x92ee;
    }
    else {
      if (subroutineUniform_local._4_4_ != 0x91b9) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                      ,0x70f,
                      "long glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::runQueryUniformSubroutine(const CompiledProgram &, GLenum, const SubroutineUniform &, std::set<GLuint> &, GLint)"
                     );
      }
      local_1f4 = 0x92f3;
    }
    GVar3 = local_1f4;
    GVar1 = pCStack_18->name;
    std::__cxx11::ostringstream::str();
    pGVar7 = (GLchar *)std::__cxx11::string::c_str();
    kVar5 = glu::CallLogWrapper::glGetProgramResourceLocation
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,GVar3,
                       pGVar7);
    std::__cxx11::string::~string(local_218);
    local_1f8 = kVar5;
    if (local_1d0[0] != kVar5) {
      lStack_40 = -1;
      Logger::Logger(&local_398);
      pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<
                         ((Logger *)&local_398,(char (*) [33])"Locations of subrutine uniform \"");
      std::__cxx11::ostringstream::str();
      pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<
                         ((Logger *)pLVar8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &reservedLocation);
      pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<
                         ((Logger *)pLVar8,
                          (char (*) [84])
                          "\" returned by glGetUniformLocation and differ glGetProgramResourceLocation differ: "
                         );
      pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar8,(int *)local_1d0);
      pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<
                         ((Logger *)pLVar8,(char (*) [5])0x2a2c5a5);
      pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar8,(int *)&local_1f8);
      glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar8,(char (*) [2])0x2b6cb9a);
      std::__cxx11::string::~string((string *)&reservedLocation);
      Logger::~Logger(&local_398);
    }
    bVar4 = DefOccurence::occurs
                      ((DefOccurence *)
                       &usedLocations_local[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       subroutineUniform_local._4_4_);
    local_b01 = 0;
    if (bVar4) {
      local_b01 = *(byte *)((long)&usedLocations_local[1]._M_t._M_impl.super__Rb_tree_header.
                                   _M_header._M_left + 4);
    }
    local_3b9 = local_b01 & 1;
    local_3c0 = 0xffffffff;
    psVar2 = usedLocations_local + 1;
    std::allocator<unsigned_int>::allocator(&local_3d9);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&expected,1,
               (value_type_conflict4 *)((long)&subroutineUniform_local + 4),&local_3d9);
    bVar4 = LayoutSpecifierBase::isImplicit
                      ((LayoutSpecifierBase *)&(psVar2->_M_t)._M_impl.super__Rb_tree_header,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&expected);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&expected);
    std::allocator<unsigned_int>::~allocator(&local_3d9);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      if ((local_3b9 & 1) != 0) {
        if ((int)local_1d0[0] < 0) {
          lStack_40 = -1;
          Logger::Logger(&local_700);
          pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<
                             ((Logger *)&local_700,(char (*) [32])"Unexpected subroutine uniform \""
                             );
          std::__cxx11::ostringstream::str();
          pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar8,&local_720);
          pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<
                             ((Logger *)pLVar8,
                              (char (*) [42])"\" location: expected positive value, got ");
          pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<
                             ((Logger *)pLVar8,(int *)local_1d0);
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar8,(char (*) [2])0x2b6cb9a)
          ;
          std::__cxx11::string::~string((string *)&local_720);
          Logger::~Logger(&local_700);
        }
        else {
          local_3c0 = local_1d0[0];
        }
      }
    }
    else {
      local_3e0 = usedLocations_local[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
                  name._372_4_;
      if ((local_3e0 != local_1d0[0]) && (((local_3b9 & 1) != 0 || (local_1d0[0] != 0xffffffff)))) {
        lStack_40 = -1;
        Logger::Logger(&local_560);
        pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<
                           ((Logger *)&local_560,(char (*) [32])"Unexpected subroutine uniform \"");
        std::__cxx11::ostringstream::str();
        pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar8,&local_580);
        pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<
                           ((Logger *)pLVar8,(char (*) [22])"\" location: expected ");
        pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<
                           ((Logger *)pLVar8,(int *)&local_3e0);
        pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<
                           ((Logger *)pLVar8,(char (*) [7])0x2c67b94);
        pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar8,(int *)local_1d0)
        ;
        glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar8,(char (*) [2])0x2b6cb9a);
        std::__cxx11::string::~string((string *)&local_580);
        Logger::~Logger(&local_560);
      }
      local_3c0 = local_3e0;
    }
    if (-1 < (int)local_3c0) {
      local_72c = local_3c0;
      local_728._M_node =
           (_Base_ptr)
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                     (psStack_30,&local_72c);
      local_738._M_node =
           (_Base_ptr)
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                     (psStack_30);
      bVar4 = std::operator!=(&local_728,&local_738);
      if (bVar4) {
        lStack_40 = -1;
        Logger::Logger(&local_8b8);
        pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<
                           ((Logger *)&local_8b8,(char (*) [21])"Subroutine uniform \"");
        std::__cxx11::ostringstream::str();
        pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar8,&local_8d8);
        pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<
                           ((Logger *)pLVar8,(char (*) [13])"\" location (");
        pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<
                           ((Logger *)pLVar8,(int *)&local_3c0);
        glcts::(anonymous_namespace)::Logger::operator<<
                  ((Logger *)pLVar8,(char (*) [17])") is not unique.");
        std::__cxx11::string::~string((string *)&local_8d8);
        Logger::~Logger(&local_8b8);
      }
      local_8dc = local_3c0;
      pVar9 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                        (psStack_30,&local_8dc);
      local_8f0 = (_Base_ptr)pVar9.first._M_node;
      local_8e8 = pVar9.second;
    }
    if ((-1 < (int)local_1d0[0]) && (ret._4_4_ <= (int)local_1d0[0])) {
      lStack_40 = -1;
      Logger::Logger(&local_a70);
      pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<
                         ((Logger *)&local_a70,(char (*) [21])"Subroutine uniform \"");
      std::__cxx11::ostringstream::str();
      pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar8,&local_a90);
      pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<
                         ((Logger *)pLVar8,(char (*) [22])"\" returned location (");
      pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar8,(int *)local_1d0);
      pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<
                         ((Logger *)pLVar8,
                          (char (*) [51])") is greater than implementation dependent limit (");
      pLVar8 = glcts::(anonymous_namespace)::Logger::operator<<
                         ((Logger *)pLVar8,(int *)((long)&ret + 4));
      glcts::(anonymous_namespace)::Logger::operator<<((Logger *)pLVar8,(char (*) [3])0x2c23dab);
      std::__cxx11::string::~string((string *)&local_a90);
      Logger::~Logger(&local_a70);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    name._372_4_ = name._372_4_ + 1;
  } while( true );
}

Assistant:

long runQueryUniformSubroutine(const CompiledProgram& program, GLenum stage,
								   const SubroutineUniform& subroutineUniform, std::set<GLuint>& usedLocations,
								   GLint max)
	{
		long ret = NO_ERROR;
		/*
		 glGetSubroutineUniformLocation(program, shaderType, name)
		 Query passes if returned value is unique in current program stage,
		 matches explicit location (if passed in GLSL code) and is less than
		 value of GL_MAX_SUBROUTINE_UNIFORM_LOCATIONS.

		 glGetProgramResourceLocation(program, GL_(VERTEX|FRAGMENT|COMPUTE|...
		 ..._SUBROUTINE_UNIFORM, name)
		 Query passes if returned value matches value returned from
		 glGetUniformLocation().
		 */

		for (int arrayElem = 0; arrayElem < subroutineUniform.arraySize; arrayElem++)
		{
			std::ostringstream name;
			name << subroutineUniform.getName();

			subroutineUniform.streamArrayStr(name, arrayElem);

			GLint returned = glGetSubroutineUniformLocation(program.name, stage, name.str().c_str());

			glw::GLenum piqStage = 0;
			switch (stage)
			{
			case GL_VERTEX_SHADER:
				piqStage = GL_VERTEX_SUBROUTINE_UNIFORM;
				break;
			case GL_FRAGMENT_SHADER:
				piqStage = GL_FRAGMENT_SUBROUTINE_UNIFORM;
				break;
			case GL_COMPUTE_SHADER:
				piqStage = GL_COMPUTE_SUBROUTINE_UNIFORM;
				break;
			default:
				assert(0);
			}

			GLint returnedPIQ = glGetProgramResourceLocation(program.name, piqStage, name.str().c_str());

			if (returned != returnedPIQ)
			{
				ret |= ERROR;
				Logger() << "Locations of subrutine uniform \"" << name.str()
						 << "\" returned by glGetUniformLocation and differ glGetProgramResourceLocation differ: "
						 << returned << " != " << returnedPIQ << ".";
			}

			bool used = subroutineUniform.defOccurence.occurs(stage) && subroutineUniform.used;

			GLint reservedLocation = -1;

			if (!subroutineUniform.location.isImplicit(std::vector<glw::GLenum>(1, stage)))
			{
				//Validate uniform location against explicit value
				GLint expected = subroutineUniform.location.val + arrayElem;
				if (!(expected == returned || (!used && returned == -1)))
				{
					ret |= ERROR;
					Logger() << "Unexpected subroutine uniform \"" << name.str() << "\" location: expected " << expected
							 << ", got " << returned << ".";
				}

				reservedLocation = expected;
			}
			else
			{
				//Check if location > 0 if used;
				if (used)
				{
					if (returned < 0)
					{
						ret |= ERROR;
						Logger() << "Unexpected subroutine uniform \"" << name.str()
								 << "\" location: expected positive value, got " << returned << ".";
					}
					else
					{
						reservedLocation = returned;
					}
				}
			}

			if (reservedLocation >= 0)
			{
				//check if location is unique
				if (usedLocations.find(reservedLocation) != usedLocations.end())
				{
					ret |= ERROR;
					Logger() << "Subroutine uniform \"" << name.str() << "\" location (" << reservedLocation
							 << ") is not unique.";
				}
				usedLocations.insert(reservedLocation);
			}

			if (returned >= 0)
			{
				//check if location is less than max

				if (returned >= max)
				{
					ret |= ERROR;
					Logger() << "Subroutine uniform \"" << name.str() << "\" returned location (" << returned
							 << ") is greater than implementation dependent limit (" << max << ").";
				}
			}
		}
		return ret;
	}